

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_leadingNumbers.cpp
# Opt level: O3

void __thiscall
leadingNumbers_edgeCases_Test::~leadingNumbers_edgeCases_Test(leadingNumbers_edgeCases_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(leadingNumbers, edgeCases)
{
    size_t index = 0;
    auto res = testLeadingNumber("67.2*45.6*0.0*19.7", index);
    EXPECT_EQ(res, 0.0);
    EXPECT_GE(index, 18U);

    res = testLeadingNumber("5.6245e-425", index);
    EXPECT_EQ(res, 0.0);
    // should be below representable range for even quad precision double
    res = testLeadingNumber("5.6245e-6985", index);
    EXPECT_EQ(res, 0.0);
}